

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIndexedStateQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::BlendEquationCase::iterate(BlendEquationCase *this)

{
  GLenum *pGVar1;
  GLenum *pGVar2;
  int *piVar3;
  TestLog *pTVar4;
  int iVar5;
  GLenum err;
  undefined4 extraout_var;
  int ndx;
  GLuint GVar6;
  undefined4 *puVar7;
  undefined4 *puVar8;
  ulong uVar9;
  ulong uVar10;
  allocator<char> local_e6;
  allocator<char> local_e5;
  deInt32 maxDrawBuffers;
  ScopedLogSection section;
  CallLogWrapper gl;
  string local_c0;
  string local_a0;
  ResultCollector result;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar5),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0," // ERROR: ",(allocator<char> *)&local_a0);
  tcu::ResultCollector::ResultCollector(&result,pTVar4,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  maxDrawBuffers = 0;
  gl.m_enableLog = true;
  glu::CallLogWrapper::glGetIntegerv(&gl,0x8824,&maxDrawBuffers);
  err = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(err,"glGetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                  ,0x4de);
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"Initial",&local_e5);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"Initial value",&local_e6);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar4,&local_c0,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  for (iVar5 = 0; iVar5 < maxDrawBuffers; iVar5 = iVar5 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x8009,iVar5,0x8006,this->m_verifierType);
  }
  for (iVar5 = 0; iVar5 < maxDrawBuffers; iVar5 = iVar5 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x883d,iVar5,0x8006,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"AfterSettingCommon",&local_e5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"After setting common",&local_e6);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar4,&local_c0,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  glu::CallLogWrapper::glBlendEquation(&gl,0x800a);
  for (iVar5 = 0; iVar5 < maxDrawBuffers; iVar5 = iVar5 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x8009,iVar5,0x800a,this->m_verifierType);
  }
  for (iVar5 = 0; iVar5 < maxDrawBuffers; iVar5 = iVar5 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x883d,iVar5,0x800a,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"AfterSettingCommonSeparate",&local_e5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"After setting common separate",&local_e6);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar4,&local_c0,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  glu::CallLogWrapper::glBlendEquationSeparate(&gl,0x800b,0x800a);
  for (iVar5 = 0; iVar5 < maxDrawBuffers; iVar5 = iVar5 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x8009,iVar5,0x800b,this->m_verifierType);
  }
  for (iVar5 = 0; iVar5 < maxDrawBuffers; iVar5 = iVar5 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x883d,iVar5,0x800a,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"AfterSettingIndexed",&local_e5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"After setting indexed",&local_e6);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar4,&local_c0,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  puVar7 = &DAT_018ae890;
  uVar9 = 0;
  while( true ) {
    if (maxDrawBuffers <= (int)(GLuint)uVar9) break;
    glu::CallLogWrapper::glBlendEquationi(&gl,(GLuint)uVar9,puVar7[(uVar9 / 5) * -5]);
    uVar9 = uVar9 + 1;
    puVar7 = puVar7 + 1;
  }
  puVar7 = &DAT_018ae890;
  uVar9 = 0;
  while( true ) {
    if (maxDrawBuffers <= (int)uVar9) break;
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x8009,(int)uVar9,puVar7[(uVar9 / 5) * -5],this->m_verifierType);
    uVar9 = uVar9 + 1;
    puVar7 = puVar7 + 1;
  }
  puVar7 = &DAT_018ae890;
  uVar9 = 0;
  while( true ) {
    if (maxDrawBuffers <= (int)uVar9) break;
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x883d,(int)uVar9,puVar7[(uVar9 / 5) * -5],this->m_verifierType);
    uVar9 = uVar9 + 1;
    puVar7 = puVar7 + 1;
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"AfterSettingIndexedSeparate",&local_e5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"After setting indexed separate",&local_e6);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar4,&local_c0,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  puVar8 = &DAT_018ae890;
  puVar7 = &DAT_018ae894;
  uVar9 = 1;
  uVar10 = 0;
  while( true ) {
    GVar6 = (GLuint)uVar10;
    if (maxDrawBuffers <= (int)GVar6) break;
    pGVar1 = puVar8 + (uVar10 / 5) * -5;
    uVar10 = uVar10 + 1;
    pGVar2 = puVar7 + (uVar9 / 5) * -5;
    puVar8 = puVar8 + 1;
    puVar7 = puVar7 + 1;
    uVar9 = uVar9 + 1;
    glu::CallLogWrapper::glBlendEquationSeparatei(&gl,GVar6,*pGVar1,*pGVar2);
  }
  puVar7 = &DAT_018ae890;
  uVar9 = 0;
  while( true ) {
    if (maxDrawBuffers <= (int)uVar9) break;
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x8009,(int)uVar9,puVar7[(uVar9 / 5) * -5],this->m_verifierType);
    uVar9 = uVar9 + 1;
    puVar7 = puVar7 + 1;
  }
  puVar7 = &DAT_018ae894;
  uVar9 = 1;
  for (iVar5 = 0; iVar5 < maxDrawBuffers; iVar5 = iVar5 + 1) {
    piVar3 = puVar7 + (uVar9 / 5) * -5;
    puVar7 = puVar7 + 1;
    uVar9 = uVar9 + 1;
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x883d,iVar5,*piVar3,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"AfterResettingIndexedWithCommon",&local_e5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"After resetting indexed with common",&local_e6);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar4,&local_c0,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  puVar7 = &DAT_018ae890;
  uVar9 = 0;
  while( true ) {
    if (maxDrawBuffers <= (int)(GLuint)uVar9) break;
    glu::CallLogWrapper::glBlendEquationi(&gl,(GLuint)uVar9,puVar7[(uVar9 / 5) * -5]);
    uVar9 = uVar9 + 1;
    puVar7 = puVar7 + 1;
  }
  glu::CallLogWrapper::glBlendEquation(&gl,0x800a);
  for (iVar5 = 0; iVar5 < maxDrawBuffers; iVar5 = iVar5 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x8009,iVar5,0x800a,this->m_verifierType);
  }
  for (iVar5 = 0; iVar5 < maxDrawBuffers; iVar5 = iVar5 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x883d,iVar5,0x800a,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"AfterResettingIndexedWithCommonSeparate",&local_e5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"After resetting indexed with common separate",&local_e6);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar4,&local_c0,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  puVar8 = &DAT_018ae890;
  puVar7 = &DAT_018ae894;
  uVar9 = 1;
  uVar10 = 0;
  while( true ) {
    GVar6 = (GLuint)uVar10;
    if (maxDrawBuffers <= (int)GVar6) break;
    pGVar1 = puVar8 + (uVar10 / 5) * -5;
    uVar10 = uVar10 + 1;
    pGVar2 = puVar7 + (uVar9 / 5) * -5;
    puVar8 = puVar8 + 1;
    puVar7 = puVar7 + 1;
    uVar9 = uVar9 + 1;
    glu::CallLogWrapper::glBlendEquationSeparatei(&gl,GVar6,*pGVar1,*pGVar2);
  }
  glu::CallLogWrapper::glBlendEquationSeparate(&gl,0x800b,0x800a);
  for (iVar5 = 0; iVar5 < maxDrawBuffers; iVar5 = iVar5 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x8009,iVar5,0x800b,this->m_verifierType);
  }
  for (iVar5 = 0; iVar5 < maxDrawBuffers; iVar5 = iVar5 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x883d,iVar5,0x800a,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  tcu::ResultCollector::setTestContextResult
            (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector(&result);
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  return STOP;
}

Assistant:

BlendEquationCase::IterateResult BlendEquationCase::iterate (void)
{
	const deUint32 blendEquations[] =
	{
		GL_FUNC_ADD,
		GL_FUNC_SUBTRACT,
		GL_FUNC_REVERSE_SUBTRACT,
		GL_MIN,
		GL_MAX
	};

	glu::CallLogWrapper		gl				(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result			(m_testCtx.getLog(), " // ERROR: ");
	deInt32					maxDrawBuffers = 0;

	gl.enableLogging(true);

	gl.glGetIntegerv(GL_MAX_DRAW_BUFFERS, &maxDrawBuffers);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "glGetIntegerv");

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial value");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_RGB, ndx, GL_FUNC_ADD, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_ALPHA, ndx, GL_FUNC_ADD, m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterSettingCommon", "After setting common");

		gl.glBlendEquation(GL_FUNC_SUBTRACT);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_RGB, ndx, GL_FUNC_SUBTRACT, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_ALPHA, ndx, GL_FUNC_SUBTRACT, m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterSettingCommonSeparate", "After setting common separate");

		gl.glBlendEquationSeparate(GL_FUNC_REVERSE_SUBTRACT, GL_FUNC_SUBTRACT);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_RGB, ndx, GL_FUNC_REVERSE_SUBTRACT, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_ALPHA, ndx, GL_FUNC_SUBTRACT, m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterSettingIndexed", "After setting indexed");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			gl.glBlendEquationi(ndx, blendEquations[ndx % DE_LENGTH_OF_ARRAY(blendEquations)]);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_RGB, ndx, blendEquations[ndx % DE_LENGTH_OF_ARRAY(blendEquations)], m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_ALPHA, ndx, blendEquations[ndx % DE_LENGTH_OF_ARRAY(blendEquations)], m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterSettingIndexedSeparate", "After setting indexed separate");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			gl.glBlendEquationSeparatei(ndx, blendEquations[ndx % DE_LENGTH_OF_ARRAY(blendEquations)], blendEquations[(ndx + 1) % DE_LENGTH_OF_ARRAY(blendEquations)]);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_RGB, ndx, blendEquations[ndx % DE_LENGTH_OF_ARRAY(blendEquations)], m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_ALPHA, ndx, blendEquations[(ndx + 1) % DE_LENGTH_OF_ARRAY(blendEquations)], m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterResettingIndexedWithCommon", "After resetting indexed with common");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			gl.glBlendEquationi(ndx, blendEquations[ndx % DE_LENGTH_OF_ARRAY(blendEquations)]);

		gl.glBlendEquation(GL_FUNC_SUBTRACT);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_RGB, ndx, GL_FUNC_SUBTRACT, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_ALPHA, ndx, GL_FUNC_SUBTRACT, m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterResettingIndexedWithCommonSeparate", "After resetting indexed with common separate");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			gl.glBlendEquationSeparatei(ndx, blendEquations[ndx % DE_LENGTH_OF_ARRAY(blendEquations)], blendEquations[(ndx + 1) % DE_LENGTH_OF_ARRAY(blendEquations)]);

		gl.glBlendEquationSeparate(GL_FUNC_REVERSE_SUBTRACT, GL_FUNC_SUBTRACT);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_RGB, ndx, GL_FUNC_REVERSE_SUBTRACT, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_ALPHA, ndx, GL_FUNC_SUBTRACT, m_verifierType);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}